

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O0

bool __thiscall mnf::Manifold::isInM(Manifold *this,VectorXd *val,double prec)

{
  bool bVar1;
  int iVar2;
  Index IVar3;
  Index IVar4;
  bool local_21;
  double prec_local;
  VectorXd *val_local;
  Manifold *this_local;
  
  bVar1 = ValidManifold::isValid(&this->super_ValidManifold);
  local_21 = true;
  if (!bVar1) {
    local_21 = ValidManifold::seeMessageAbove(&this->super_ValidManifold);
  }
  if (local_21 == false) {
    __assert_fail("isValid() || seeMessageAbove()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0x40,"virtual bool mnf::Manifold::isInM(const Eigen::VectorXd &, double) const");
  }
  IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)val);
  IVar4 = representationDim(this);
  if (IVar3 == IVar4) {
    iVar2 = (*this->_vptr_Manifold[0xd])(prec,this,val);
    return (bool)((byte)iVar2 & 1);
  }
  __assert_fail("val.size() == representationDim()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                ,0x41,"virtual bool mnf::Manifold::isInM(const Eigen::VectorXd &, double) const");
}

Assistant:

bool Manifold::isInM(const Eigen::VectorXd& val, double prec) const
{
  mnf_assert(isValid() || seeMessageAbove());
  mnf_assert(val.size() == representationDim());
  return isInM_(val, prec);
}